

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O2

HRESULT Js::SCACore::ValidateTransferableVars(Var *vars,size_t count)

{
  Type TVar1;
  Var aValue;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  size_t sVar6;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  sVar6 = 0;
  do {
    if (count == sVar6) {
      return 0;
    }
    aValue = vars[sVar6];
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d5ad42;
      *puVar5 = 0;
    }
    bVar3 = TaggedInt::Is(aValue);
    if (((ulong)aValue >> 0x32 != 0) || (bVar3)) {
LAB_00d5acf6:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCACore.cpp"
                                  ,0x14,"(false)","These should have been filtered out by the host."
                                 );
      if (bVar3) {
        *puVar5 = 0;
        return -0x7ffbeffd;
      }
LAB_00d5ad42:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    this = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d5ad42;
      *puVar5 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if (0x57 < (int)TVar1) {
      BVar4 = RecyclableObject::IsExternal(this);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00d5ad42;
        *puVar5 = 0;
      }
      goto LAB_00d5acf6;
    }
    if (TVar1 != TypeIds_ArrayBuffer) goto LAB_00d5acf6;
    bVar3 = JavascriptOperators::IsObjectDetached(vars[sVar6]);
    sVar6 = sVar6 + 1;
    if (bVar3) {
      return -0x7ffbeffc;
    }
  } while( true );
}

Assistant:

HRESULT ValidateTransferableVars(Var *vars, size_t count)
        {
            for (size_t i = 0; i < count; i++)
            {
                Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(vars[i]);
                if (typeId != TypeIds_ArrayBuffer)
                {

                    AssertMsg(false, "These should have been filtered out by the host.");
                    return E_SCA_TRANSFERABLE_UNSUPPORTED;
                }

                if (Js::JavascriptOperators::IsObjectDetached(vars[i]))
                {
                    return E_SCA_TRANSFERABLE_NEUTERED;
                }
            }
            return S_OK;
        }